

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_map.h
# Opt level: O0

void __thiscall
cppcms::impl::details::intrusive_list<$b487a5d2$>::insert_after
          (intrusive_list<_b487a5d2_> *this,container *p,container *after_me)

{
  container *in_RDX;
  container *in_RSI;
  intrusive_list<_b487a5d2_> *in_RDI;
  
  if (in_RDX->next == (container *)0x0) {
    push_back(in_RDI,in_RSI);
  }
  else {
    in_RSI->prev = in_RDX;
    in_RSI->next = in_RDX->next;
    if (in_RDX->next != (container *)0x0) {
      in_RDX->next->prev = in_RSI;
    }
    in_RDX->next = in_RSI;
  }
  return;
}

Assistant:

void insert_after(T *p,T *after_me)
	{
		if(!after_me->next) {
			push_back(p);
			return;
		}
		p->prev = after_me;
		p->next = after_me->next;
		if(after_me->next)
			after_me->next->prev = p;
		after_me->next = p;
	}